

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_> * __thiscall
kj::ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_>::operator=
          (ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_> *this,
          ArrayBuilder<capnp::Orphan<capnp::json::Value::Field>_> *other)

{
  Orphan<capnp::json::Value::Field> *pOVar1;
  RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *pRVar2;
  Orphan<capnp::json::Value::Field> *pOVar3;
  ArrayDisposer *pAVar4;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (Orphan<capnp::json::Value::Field> *)0x0) {
    pRVar2 = this->pos;
    pOVar3 = this->endPtr;
    this->ptr = (Orphan<capnp::json::Value::Field> *)0x0;
    this->pos = (RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *)0x0;
    this->endPtr = (Orphan<capnp::json::Value::Field> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pOVar1,0x20,(long)pRVar2 - (long)pOVar1 >> 5,
               (long)pOVar3 - (long)pOVar1 >> 5,
               ArrayDisposer::Dispose_<capnp::Orphan<capnp::json::Value::Field>,_false>::destruct);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (Orphan<capnp::json::Value::Field> *)0x0;
  other->pos = (RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *)0x0;
  other->endPtr = (Orphan<capnp::json::Value::Field> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }